

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_68;
  size_t streamingSize;
  size_t outBuffSize;
  size_t inBuffSize;
  size_t blockSize;
  size_t CCtxSize;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params *params_local;
  
  if (params->nbWorkers < 1) {
    cParams._20_8_ = params;
    ZSTD_getCParamsFromCCtxParams((ZSTD_compressionParameters *)((long)&CCtxSize + 4),params,0,0);
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams((ZSTD_CCtx_params *)cParams._20_8_);
    if ((ulong)(1L << (CCtxSize._4_1_ & 0x3f)) < 0x20001) {
      local_68 = 1L << (CCtxSize._4_1_ & 0x3f);
    }
    else {
      local_68 = 0x20000;
    }
    sVar2 = ZSTD_compressBound(local_68);
    params_local = (ZSTD_CCtx_params *)
                   (sVar1 + (1L << (CCtxSize._4_1_ & 0x3f)) + local_68 + sVar2 + 1);
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, 0, 0);
        size_t const CCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(params);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = ((size_t)1 << cParams.windowLog) + blockSize;
        size_t const outBuffSize = ZSTD_compressBound(blockSize) + 1;
        size_t const streamingSize = inBuffSize + outBuffSize;

        return CCtxSize + streamingSize;
    }
}